

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  pointer pSVar4;
  pointer pSVar5;
  deUint32 dVar6;
  int iVar7;
  EnvClone *this;
  long *plVar8;
  int *piVar9;
  Resources *this_00;
  ThreadGroupThread *this_01;
  uint uVar10;
  ulong uVar11;
  allocator_type *__a;
  allocator_type *__a_00;
  size_type __n;
  long lVar12;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  Parameters deviceParams;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
  resources;
  ThreadGroup threads;
  Environment sharedEnv;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_e0;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  local_d0;
  ulong local_b8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
  local_b0;
  ThreadGroup local_98;
  Environment local_68;
  
  dVar6 = deGetNumAvailableLogicalCores();
  uVar10 = 8;
  if (dVar6 < 8) {
    uVar10 = dVar6;
  }
  __n = 2;
  if (2 < uVar10) {
    __n = (size_type)uVar10;
  }
  iVar7 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  uVar11 = (ulong)(iVar7 - 1) | 0x300000000;
  local_68.vkp = context->m_platformInterface;
  local_b8 = uVar11;
  local_68.vkd = Context::getDeviceInterface(context);
  local_68.device = Context::getDevice(context);
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.programBinaries = context->m_progCollection;
  local_68.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_68.maxResourceConsumers = (deUint32)__n;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector(&local_d0,__n,__a);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
  ::vector(&local_b0,__n,__a_00);
  ThreadGroup::ThreadGroup(&local_98);
  lVar12 = 0;
  do {
    this = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(this,&local_68,(Parameters *)&local_b8,(deUint32)uVar11);
    plVar8 = (long *)operator_new(0x20);
    pSVar4 = local_d0.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar8 + 1) = 0;
    *(undefined4 *)((long)plVar8 + 0xc) = 0;
    *plVar8 = (long)&PTR__SharedPtrState_00cee258;
    plVar8[2] = (long)this;
    *(undefined4 *)(plVar8 + 1) = 1;
    *(undefined4 *)((long)plVar8 + 0xc) = 1;
    plVar1 = *(long **)((long)&(local_d0.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar12);
    if (plVar1 != plVar8) {
      if (plVar1 != (long *)0x0) {
        LOCK();
        plVar1 = plVar1 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          *(undefined8 *)
           ((long)&(local_d0.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12) = 0;
          (**(code **)(**(long **)((long)&(local_d0.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar12) + 0x10))();
        }
        LOCK();
        piVar9 = (int *)(*(long *)((long)&pSVar4->m_state + lVar12) + 0xc);
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          plVar1 = *(long **)((long)&pSVar4->m_state + lVar12);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          *(undefined8 *)((long)&pSVar4->m_state + lVar12) = 0;
        }
      }
      *(EnvClone **)((long)&pSVar4->m_ptr + lVar12) = this;
      *(long **)((long)&pSVar4->m_state + lVar12) = plVar8;
      LOCK();
      *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
      UNLOCK();
      LOCK();
      piVar9 = (int *)(*(long *)((long)&pSVar4->m_state + lVar12) + 0xc);
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    plVar1 = plVar8 + 1;
    LOCK();
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar8 + 0x10))(plVar8);
    }
    piVar9 = (int *)((long)plVar8 + 0xc);
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      (**(code **)(*plVar8 + 8))(plVar8);
    }
    this_00 = (Resources *)operator_new(0x30);
    PipelineLayout::Resources::Resources
              (this_00,(Environment *)
                       (*(long *)((long)&(local_d0.
                                          super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12
                                 ) + 0x688),params);
    plVar8 = (long *)operator_new(0x20);
    pSVar5 = local_b0.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar8 + 1) = 0;
    *(undefined4 *)((long)plVar8 + 0xc) = 0;
    *plVar8 = (long)&PTR__SharedPtrState_00cee908;
    plVar8[2] = (long)this_00;
    *(undefined4 *)(plVar8 + 1) = 1;
    *(undefined4 *)((long)plVar8 + 0xc) = 1;
    plVar1 = *(long **)((long)&(local_b0.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar12);
    if (plVar1 != plVar8) {
      if (plVar1 != (long *)0x0) {
        LOCK();
        plVar1 = plVar1 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        UNLOCK();
        if ((int)*plVar1 == 0) {
          *(undefined8 *)
           ((long)&(local_b0.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12) = 0;
          (**(code **)(**(long **)((long)&(local_b0.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar12) + 0x10))();
        }
        LOCK();
        piVar9 = (int *)(*(long *)((long)&pSVar5->m_state + lVar12) + 0xc);
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          plVar1 = *(long **)((long)&pSVar5->m_state + lVar12);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          *(undefined8 *)((long)&pSVar5->m_state + lVar12) = 0;
        }
      }
      *(Resources **)((long)&pSVar5->m_ptr + lVar12) = this_00;
      *(long **)((long)&pSVar5->m_state + lVar12) = plVar8;
      LOCK();
      *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
      UNLOCK();
      LOCK();
      piVar9 = (int *)(*(long *)((long)&pSVar5->m_state + lVar12) + 0xc);
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    plVar1 = plVar8 + 1;
    LOCK();
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar8 + 0x10))(plVar8);
    }
    piVar9 = (int *)((long)plVar8 + 0xc);
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      (**(code **)(*plVar8 + 8))(plVar8);
    }
    this_01 = (ThreadGroupThread *)operator_new(0x88);
    lVar2 = *(long *)((long)&(local_d0.
                              super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12);
    uVar3 = *(undefined8 *)
             ((long)&(local_b0.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar12);
    ThreadGroupThread::ThreadGroupThread(this_01);
    (this_01->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00cee948;
    this_01[1].super_Thread._vptr_Thread = (_func_int **)(lVar2 + 0x688);
    *(undefined8 *)&this_01[1].super_Thread.m_attribs = uVar3;
    this_01[1].super_Thread.m_thread = (deThread)params;
    local_e0.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_01;
    ThreadGroup::add(&local_98,&local_e0);
    if (local_e0.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_e0.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_e0.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    lVar12 = lVar12 + 0x10;
  } while (__n << 4 != lVar12);
  ThreadGroup::run(__return_storage_ptr__,&local_98);
  de::SpinBarrier::~SpinBarrier(&local_98.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_98.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineLayout::Resources>_>_>
  ::~vector(&local_b0);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}